

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

bool __thiscall
dg::llvmdg::legacy::GraphBuilder::createPthreadCreate
          (GraphBuilder *this,CallInst *callInst,Block *lastBlock)

{
  Function *llvmFunction;
  Function **ppFVar1;
  Function *function;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *__range2;
  Function **ppFVar2;
  iterator __end2;
  iterator iVar3;
  pointer ppFVar4;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> forkFunctionsWithBlock;
  Function *forkFunction;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> forkFunctions;
  Function **local_68;
  iterator iStack_60;
  Function **local_58;
  Function *local_50;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_48;
  
  getCalledFunctions(&local_48,this,
                     *(Value **)(callInst + (0x40 - (ulong)(uint)(*(int *)(callInst + 0x14) << 5))))
  ;
  local_68 = (Function **)0x0;
  iStack_60._M_current = (Function **)0x0;
  local_58 = (Function **)0x0;
  if (local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ppFVar2 = (Function **)0x0;
    iVar3._M_current = (Function **)0x0;
  }
  else {
    ppFVar4 = local_48.
              super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      local_50 = *ppFVar4;
      if (*(Function **)(local_50 + 0x48) != local_50 + 0x48) {
        if (iStack_60._M_current == local_58) {
          std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
          _M_realloc_insert<llvm::Function_const*const&>
                    ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                     &local_68,iStack_60,&local_50);
        }
        else {
          *iStack_60._M_current = local_50;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
      }
      iVar3._M_current = iStack_60._M_current;
      ppFVar2 = local_68;
      ppFVar4 = ppFVar4 + 1;
      ppFVar1 = local_68;
    } while (ppFVar4 !=
             local_48.
             super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    for (; ppFVar1 != iVar3._M_current; ppFVar1 = ppFVar1 + 1) {
      llvmFunction = *ppFVar1;
      function = createOrGetFunction(this,llvmFunction);
      Block::addFork(lastBlock,llvmFunction,function);
    }
    if (local_68 != (Function **)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
  }
  if (local_48.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar3._M_current != ppFVar2;
}

Assistant:

bool GraphBuilder::createPthreadCreate(const llvm::CallInst *callInst,
                                       Block *lastBlock) {
    bool createBlock = false;
    llvm::Value *calledValue = callInst->getArgOperand(2);
    auto forkFunctions = getCalledFunctions(calledValue);
    std::vector<const llvm::Function *> forkFunctionsWithBlock;
    for (const auto *forkFunction : forkFunctions) {
        if (!forkFunction->empty()) {
            forkFunctionsWithBlock.push_back(forkFunction);
        }
    }
    createBlock |= forkFunctionsWithBlock.size();
    for (const auto *forkFunction : forkFunctionsWithBlock) {
        auto *function = createOrGetFunction(forkFunction);
        lastBlock->addFork(forkFunction, function);
    }
    return createBlock;
}